

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# jpgd.cpp
# Opt level: O2

void __thiscall jpgd::jpeg_decoder::check_quant_tables(jpeg_decoder *this)

{
  int *piVar1;
  int i;
  long lVar2;
  
  lVar2 = 0;
  do {
    if (this->m_comps_in_scan <= lVar2) {
      return;
    }
    piVar1 = this->m_comp_list + lVar2;
    lVar2 = lVar2 + 1;
  } while (this->m_quant[this->m_comp_quant[*piVar1]] != (jpgd_quant_t *)0x0);
  stop_decoding(this,JPGD_UNDEFINED_QUANT_TABLE);
}

Assistant:

void jpeg_decoder::check_quant_tables()
	{
		for (int i = 0; i < m_comps_in_scan; i++)
			if (m_quant[m_comp_quant[m_comp_list[i]]] == nullptr)
				stop_decoding(JPGD_UNDEFINED_QUANT_TABLE);
	}